

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

mat4 * __thiscall Camera::get_view(Camera *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  mat4 *in_RDI;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar1 = (this->position).field_2.z;
  fVar11 = (this->direction).field_0.x;
  fVar12 = (this->right).field_0.x;
  uVar2 = (this->direction).field_1;
  uVar6 = (this->direction).field_2;
  uVar3 = (this->right).field_1;
  uVar7 = (this->right).field_2;
  fVar16 = (float)uVar6 * (float)uVar3 - (float)uVar7 * (float)uVar2;
  fVar17 = fVar11 * (float)uVar7 - fVar12 * (float)uVar6;
  fVar15 = fVar12 * (float)uVar2 - (float)uVar3 * fVar11;
  (this->up).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar16;
  (this->up).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fVar17;
  (this->up).field_2.z = fVar15;
  fVar11 = ((float)uVar6 + fVar1) - fVar1;
  uVar4 = (this->direction).field_0;
  uVar8 = (this->direction).field_1;
  in_RDI->value[0].field_3.w = 0.0;
  in_RDI->value[1].field_3.w = 0.0;
  in_RDI->value[2].field_3.w = 0.0;
  in_RDI->value[3].field_3.w = 1.0;
  uVar5 = (this->position).field_0;
  uVar9 = (this->position).field_1;
  fVar13 = ((float)uVar4 + (float)uVar5) - (float)uVar5;
  fVar14 = ((float)uVar8 + (float)uVar9) - (float)uVar9;
  fVar12 = 1.0 / SQRT(fVar14 * fVar14 + fVar13 * fVar13 + fVar11 * fVar11);
  fVar11 = fVar11 * fVar12;
  fVar13 = fVar12 * fVar13;
  fVar12 = fVar12 * fVar14;
  fVar18 = fVar11 * fVar16 - fVar13 * fVar15;
  fVar16 = fVar17 * fVar13 - fVar12 * fVar16;
  fVar17 = fVar15 * fVar12 - fVar11 * fVar17;
  fVar14 = 1.0 / SQRT(fVar17 * fVar17 + fVar18 * fVar18 + fVar16 * fVar16);
  fVar17 = fVar17 * fVar14;
  fVar18 = fVar18 * fVar14;
  fVar14 = fVar14 * fVar16;
  fVar16 = fVar18 * fVar11 - fVar14 * fVar12;
  fVar19 = fVar14 * fVar13 - fVar17 * fVar11;
  in_RDI->value[0].field_0.x = fVar17;
  in_RDI->value[1].field_0.x = fVar18;
  in_RDI->value[2].field_0.x = fVar14;
  in_RDI->value[0].field_1.y = fVar16;
  fVar15 = fVar12 * fVar17 - fVar18 * fVar13;
  in_RDI->value[1].field_1.y = fVar19;
  in_RDI->value[2].field_1.y = fVar15;
  in_RDI->value[0].field_2.z = -fVar13;
  in_RDI->value[1].field_2.z = -fVar12;
  in_RDI->value[2].field_2.z = -fVar11;
  uVar10 = CONCAT44(fVar15 * fVar1 + fVar19 * (float)uVar9 + (float)uVar5 * fVar16,
                    fVar14 * fVar1 + fVar17 * (float)uVar5 + (float)uVar9 * fVar18) ^
           0x8000000080000000;
  in_RDI->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar10;
  in_RDI->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)(uVar10 >> 0x20);
  in_RDI->value[3].field_2.z = fVar12 * (float)uVar9 + fVar13 * (float)uVar5 + fVar11 * fVar1;
  return in_RDI;
}

Assistant:

glm::mat4 Camera::get_view() {
    up = glm::cross(right, direction);
    return glm::lookAt(
        position,
        position+direction,
        up
    );
}